

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O3

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
* __thiscall
chaiscript::detail::Dispatch_Engine::get_scripting_objects_abi_cxx11_
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
           *__return_storage_ptr__,Dispatch_Engine *this)

{
  _Rb_tree_header *p_Var1;
  pointer pvVar2;
  pointer ppVar3;
  _Map_base<const_void_*,_std::pair<const_void_*const,_chaiscript::detail::Stack_Holder>,_std::allocator<std::pair<const_void_*const,_chaiscript::detail::Stack_Holder>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *this_00;
  mapped_type *pmVar4;
  pointer pQVar5;
  pointer pvVar6;
  pointer pQVar7;
  pointer __args;
  Thread_Storage<chaiscript::detail::Stack_Holder> *local_38;
  
  this_00 = (_Map_base<const_void_*,_std::pair<const_void_*const,_chaiscript::detail::Stack_Holder>,_std::allocator<std::pair<const_void_*const,_chaiscript::detail::Stack_Holder>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             *)threading::Thread_Storage<chaiscript::detail::Stack_Holder>::t();
  local_38 = &this->m_stack_holder;
  pmVar4 = std::__detail::
           _Map_base<const_void_*,_std::pair<const_void_*const,_chaiscript::detail::Stack_Holder>,_std::allocator<std::pair<const_void_*const,_chaiscript::detail::Stack_Holder>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[](this_00,&local_38);
  pvVar2 = (pmVar4->stacks).
           super__Vector_base<std::vector<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>,_std::allocator<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>_>_>,_std::allocator<std::vector<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>,_std::allocator<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pvVar6 = pvVar2 + -1;
  if ((long)pvVar2 -
      (long)(pmVar4->stacks).
            super__Vector_base<std::vector<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>,_std::allocator<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>_>_>,_std::allocator<std::vector<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>,_std::allocator<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != 0x18) {
    pvVar6 = pvVar2 + -2;
  }
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  pQVar5 = (pvVar6->
           super__Vector_base<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>,_std::allocator<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  for (pQVar7 = (pvVar6->
                super__Vector_base<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>,_std::allocator<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>_>_>
                )._M_impl.super__Vector_impl_data._M_finish; pQVar7 != pQVar5; pQVar7 = pQVar7 + -1)
  {
    __args = pQVar7[-1].data.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppVar3 = pQVar7[-1].data.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (__args != ppVar3) {
      do {
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>,std::_Select1st<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>
        ::_M_emplace_unique<std::pair<std::__cxx11::string,chaiscript::Boxed_Value>const&>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>,std::_Select1st<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>
                    *)__return_storage_ptr__,__args);
        __args = __args + 1;
      } while (__args != ppVar3);
      pQVar5 = (pvVar6->
               super__Vector_base<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>,_std::allocator<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    }
  }
  std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)this);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>,std::_Select1st<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>
  ::
  _M_insert_range_unique<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>,std::_Select1st<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>
              *)__return_storage_ptr__,
             (this->m_state).m_global_objects._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>
              )&(this->m_state).m_global_objects._M_t._M_impl.super__Rb_tree_header);
  pthread_rwlock_unlock((pthread_rwlock_t *)this);
  return __return_storage_ptr__;
}

Assistant:

std::map<std::string, Boxed_Value> get_scripting_objects() const {
        const Stack_Holder &s = *m_stack_holder;

        // We don't want the current context, but one up if it exists
        const StackData &stack = (s.stacks.size() == 1) ? (s.stacks.back()) : (s.stacks[s.stacks.size() - 2]);

        std::map<std::string, Boxed_Value> retval;

        // note: map insert doesn't overwrite existing values, which is why this works
        for (auto itr = stack.rbegin(); itr != stack.rend(); ++itr) {
          retval.insert(itr->begin(), itr->end());
        }

        // add the global values
        chaiscript::detail::threading::shared_lock<chaiscript::detail::threading::shared_mutex> l(m_mutex);
        retval.insert(m_state.m_global_objects.begin(), m_state.m_global_objects.end());

        return retval;
      }